

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disassembler.cpp
# Opt level: O2

string * Disassembler::iType(string *__return_storage_ptr__,string *bin,int line)

{
  bool bVar1;
  int iVar2;
  int line_00;
  uint line_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string label;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string op;
  string rt;
  string imm;
  string rs;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::substr((ulong)&local_50,(ulong)bin);
  AsmFuncts::getOpCode(&op,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::substr((ulong)&local_70,(ulong)bin);
  AsmFuncts::getRegCode(&rs,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::substr((ulong)&local_90,(ulong)bin);
  AsmFuncts::getRegCode(&rt,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::substr((ulong)&local_b0,(ulong)bin);
  iVar2 = Conversion::binToDec(&local_b0);
  std::__cxx11::to_string(&imm,iVar2);
  std::__cxx11::string::~string((string *)&local_b0);
  bVar1 = std::operator==(&op,"sw");
  if (!bVar1) {
    bVar1 = std::operator==(&op,"lw");
    if (!bVar1) {
      bVar1 = std::operator==(&op,"lui");
      if (bVar1) {
        std::operator+(&local_210,&op," ");
        std::operator+(&local_230,&local_210,&rt);
        std::operator+(&label,&local_230,", ");
        std::operator+(__return_storage_ptr__,&label,&imm);
        std::__cxx11::string::~string((string *)&label);
        std::__cxx11::string::~string((string *)&local_230);
        this = &local_210;
      }
      else {
        bVar1 = std::operator==(&op,"bne");
        if (!bVar1) {
          bVar1 = std::operator==(&op,"beq");
          if (!bVar1) {
            std::operator+(&local_1d0,&op," ");
            std::operator+(&local_1b0,&local_1d0,&rt);
            std::operator+(&local_210,&local_1b0,", ");
            std::operator+(&local_230,&local_210,&rs);
            std::operator+(&label,&local_230,", ");
            std::operator+(__return_storage_ptr__,&label,&imm);
            std::__cxx11::string::~string((string *)&label);
            std::__cxx11::string::~string((string *)&local_230);
            std::__cxx11::string::~string((string *)&local_210);
            std::__cxx11::string::~string((string *)&local_1b0);
            this = &local_1d0;
            goto LAB_0012c901;
          }
        }
        std::__cxx11::to_string(&local_230,labelCount);
        std::operator+(&label,"LABEL_",&local_230);
        std::__cxx11::string::~string((string *)&local_230);
        iVar2 = std::__cxx11::stoi(&imm,(size_t *)0x0,10);
        line_01 = line + iVar2 + 1;
        bVar1 = labelExists(line_01);
        if (bVar1) {
          std::operator+(&local_190,&op," ");
          std::operator+(&local_1d0,&local_190,&rs);
          std::operator+(&local_1b0,&local_1d0,", ");
          std::operator+(&local_210,&local_1b0,&rt);
          std::operator+(&local_230,&local_210,", ");
          getLabel_abi_cxx11_(&local_f0,(Disassembler *)(ulong)line_01,line_00);
          std::operator+(__return_storage_ptr__,&local_230,&local_f0);
          std::__cxx11::string::~string((string *)&local_f0);
        }
        else {
          std::__cxx11::string::string((string *)&local_d0,(string *)&label);
          addLabel(line_01,&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::operator+(&local_190,&op," ");
          std::operator+(&local_1d0,&local_190,&rs);
          std::operator+(&local_1b0,&local_1d0,", ");
          std::operator+(&local_210,&local_1b0,&rt);
          std::operator+(&local_230,&local_210,", ");
          std::operator+(__return_storage_ptr__,&local_230,&label);
        }
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_190);
        this = &label;
      }
      goto LAB_0012c901;
    }
  }
  std::operator+(&local_190,&op," ");
  std::operator+(&local_1d0,&local_190,&rt);
  std::operator+(&local_1b0,&local_1d0,", ");
  std::operator+(&local_210,&local_1b0,&imm);
  std::operator+(&local_230,&local_210,"(");
  std::operator+(&label,&local_230,&rs);
  std::operator+(__return_storage_ptr__,&label,")");
  std::__cxx11::string::~string((string *)&label);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  this = &local_190;
LAB_0012c901:
  std::__cxx11::string::~string((string *)this);
  std::__cxx11::string::~string((string *)&imm);
  std::__cxx11::string::~string((string *)&rt);
  std::__cxx11::string::~string((string *)&rs);
  std::__cxx11::string::~string((string *)&op);
  return __return_storage_ptr__;
}

Assistant:

string Disassembler::iType(string bin, int line){
    string op = AsmFuncts::getOpCode(bin.substr(0,6));
    string rs = AsmFuncts::getRegCode(bin.substr(6,5));
    string rt = AsmFuncts::getRegCode(bin.substr(11,5));
    string imm = std::to_string(Conversion::binToDec(bin.substr(16,16)));
    if((op == "sw") || (op == "lw")){
        return (op + " " + rt + ", " + imm + "(" + rs + ")");
    }
    if(op == "lui"){
        return (op + " " + rt + ", " + imm);
    }
    if((op == "bne")||(op == "beq")){
        string label = "LABEL_"+to_string(labelCount);
        int l = line + stoi(imm) + 1;
        if(!labelExists(l)){
          addLabel(l,label);
          return (op + " " + rs + ", " + rt + ", "+label);
        }
        else
          return (op + " " + rs + ", " + rt + ", "+getLabel(l));
    }
    return (op + " " + rt + ", " + rs + ", " + imm);
}